

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O2

void __thiscall QSidebar::showContextMenu(QSidebar *this,QPoint *position)

{
  QAction *this_00;
  long in_FS_OFFSET;
  Object local_b8 [8];
  QModelIndex local_b0;
  QUrl local_98;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QAction_*> local_78;
  code *local_58 [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QAction **)0x0;
  local_78.size = 0;
  (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x1f0))(local_58,this,position);
  if (((-1 < (int)local_58[0]._0_4_) && (-1 < (long)local_58[0])) && (local_58[2] != (code *)0x0)) {
    this_00 = (QAction *)operator_new(0x10);
    QFileDialog::tr((QString *)local_58,"Remove",(char *)0x0,-1);
    QAction::QAction(this_00,(QString *)local_58,(QObject *)this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    (**(code **)(*(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea
                           .super_QFrame.super_QWidget + 0x1f0))(&local_b0,this,position);
    QModelIndex::data((QVariant *)local_58,&local_b0,0x101);
    ::QVariant::toUrl();
    QUrl::path(&local_90,&local_98,0x7f00000);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QUrl::~QUrl(&local_98);
    ::QVariant::~QVariant((QVariant *)local_58);
    if (local_90.size == 0) {
      QAction::setEnabled(SUB81(this_00,0));
    }
    local_58[0] = removeEntry;
    local_58[1] = (code *)0x0;
    QObject::connect<void(QAction::*)(bool),void(QSidebar::*)()>
              (local_b8,(offset_in_QAction_to_subr)this_00,(ContextType *)QAction::triggered,
               (offset_in_QSidebar_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_b8);
    QList<QAction_*>::append((QList<QAction_*> *)&local_78,this_00);
    if (local_78.size != 0) {
      local_58[0] = (code *)QWidget::mapToGlobal((QWidget *)this,position);
      QMenu::exec((QList<QAction_*> *)&local_78,(QPoint *)local_58,(QAction *)0x0,(QWidget *)0x0);
    }
  }
  QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSidebar::showContextMenu(const QPoint &position)
{
    QList<QAction *> actions;
    if (indexAt(position).isValid()) {
        QAction *action = new QAction(QFileDialog::tr("Remove"), this);
        if (indexAt(position).data(QUrlModel::UrlRole).toUrl().path().isEmpty())
            action->setEnabled(false);
        connect(action, &QAction::triggered, this, &QSidebar::removeEntry);
        actions.append(action);
    }
    if (actions.size() > 0)
        QMenu::exec(actions, mapToGlobal(position));
}